

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy *policy)

{
  size_t sVar1;
  ArenaBlock *this_00;
  char *pcVar2;
  char *pcVar3;
  
  this->tag_and_id_ = 0;
  (this->alloc_policy_).policy_ = 0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->head_)._M_b._M_p = (__pointer_type)0x0;
  this_00 = FirstBlock(this,mem,size,policy);
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).string_block_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  (this->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this->first_arena_).prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this->first_arena_).ptr_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).limit_ = (char *)0x0;
  (this->first_arena_).string_block_unused_.super___atomic_base<unsigned_long>._M_i = 0;
  (this->first_arena_).head_._M_b._M_p = this_00;
  (this->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
  sVar1 = this_00->size;
  (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = sVar1;
  (this->first_arena_).parent_ = this;
  (this->first_arena_).cached_block_length_ = '\0';
  (this->first_arena_).cached_blocks_ = (CachedBlock **)0x0;
  if (sVar1 != 0) {
    pcVar2 = ArenaBlock::Pointer(this_00,0x10);
    pcVar3 = ArenaBlock::Pointer(this_00,this_00->size & 0xfffffffffffffff8);
    (this->first_arena_).ptr_._M_b._M_p = pcVar2;
    (this->first_arena_).prefetch_ptr_ = pcVar2;
    (this->first_arena_).limit_ = pcVar3;
  }
  InitializeWithPolicy(this,policy);
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(void* mem, size_t size,
                                 const AllocationPolicy& policy)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size, policy), *this) {
  InitializeWithPolicy(policy);
}